

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O0

size_t __thiscall
GF2::MI<45UL,_GF2::MOGrlex<45UL>_>::GatherMinLMons
          (MI<45UL,_GF2::MOGrlex<45UL>_> *this,MP<45UL,_GF2::MOGrlex<45UL>_> *polyMons)

{
  bool bVar1;
  _Self *p_Var2;
  size_t sVar3;
  list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> *in_RSI;
  _Self iter1;
  iterator iter;
  list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> *in_stack_ffffffffffffffa8;
  list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> *in_stack_ffffffffffffffb0;
  const_iterator in_stack_ffffffffffffffb8;
  _List_const_iterator<GF2::MM<45UL>_> local_40;
  MP<45UL,_GF2::MOGrlex<45UL>_> *in_stack_ffffffffffffffc8;
  _List_iterator<GF2::MM<45UL>_> in_stack_ffffffffffffffd0;
  _Self local_28;
  _Self local_20;
  _Self local_18;
  list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> *local_10;
  
  local_10 = in_RSI;
  GatherLMons((MI<45UL,_GF2::MOGrlex<45UL>_> *)in_stack_ffffffffffffffd0._M_node,
              in_stack_ffffffffffffffc8);
  local_18._M_node =
       (_List_node_base *)
       std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::begin
                 (in_stack_ffffffffffffffa8);
  do {
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::end
                   (in_stack_ffffffffffffffa8);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) {
      sVar3 = MP<45UL,_GF2::MOGrlex<45UL>_>::Size((MP<45UL,_GF2::MOGrlex<45UL>_> *)0x1e0c8c);
      return sVar3;
    }
    std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::end
              (in_stack_ffffffffffffffa8);
    p_Var2 = std::_List_iterator<GF2::MM<45UL>_>::operator--
                       ((_List_iterator<GF2::MM<45UL>_> *)&stack0xffffffffffffffd0);
    local_28._M_node = p_Var2->_M_node;
    while (bVar1 = std::operator!=(&local_28,&local_18), bVar1) {
      in_stack_ffffffffffffffb8._M_node =
           (_List_node_base *)
           std::_List_iterator<GF2::MM<45UL>_>::operator*
                     ((_List_iterator<GF2::MM<45UL>_> *)in_stack_ffffffffffffffb0);
      std::_List_iterator<GF2::MM<45UL>_>::operator*
                ((_List_iterator<GF2::MM<45UL>_> *)in_stack_ffffffffffffffb0);
      bVar1 = MM<45ul>::operator|((MM<45UL> *)in_stack_ffffffffffffffb0,
                                  (MM<45UL> *)in_stack_ffffffffffffffa8);
      if (bVar1) break;
      std::_List_iterator<GF2::MM<45UL>_>::operator--(&local_28);
    }
    bVar1 = std::operator==(&local_28,&local_18);
    if (bVar1) {
      std::_List_iterator<GF2::MM<45UL>_>::operator++(&local_18);
    }
    else {
      in_stack_ffffffffffffffb0 = local_10;
      std::_List_const_iterator<GF2::MM<45UL>_>::_List_const_iterator(&local_40,&local_18);
      local_18._M_node =
           (_List_node_base *)
           std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::erase
                     (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8);
    }
  } while( true );
}

Assistant:

size_t GatherMinLMons(MP<_n, _O>& polyMons) const
	{
		GatherLMons(polyMons);
		// от старших мономов к младшим
		for (auto iter = polyMons.begin(); iter != polyMons.end();)
		{
			// от младших мономов к старшим
			auto iter1 = --polyMons.end();
			for (; iter1 != iter; --iter1)
				if (*iter1 | *iter)
					break;
			if (iter1 == iter) 
				++iter;
			else 
				iter = polyMons.erase(iter);
		}
		return polyMons.Size();
	}